

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_JoinerEnableall_Test::~InterpreterTestSuite_PC_JoinerEnableall_Test
          (InterpreterTestSuite_PC_JoinerEnableall_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_JoinerEnableall)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject,
                EnableAllJoiners(JoinerType::kMeshCoP, StrEq("psk"), StrEq("url://provision.ing")))
        .WillOnce(Return(Error{}));

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, EnableAllJoiners(JoinerType::kAE, StrEq(""), StrEq("")))
        .WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("joiner enableall meshcop psk url://provision.ing");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("joiner enableall ae");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}